

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregularexpression.cpp
# Opt level: O0

QDebug operator<<(QDebug *debug,QRegularExpression *re)

{
  long lVar1;
  QDebug *debug_00;
  QDebug *this;
  QDebugStateSaver *this_00;
  QDebug *in_RSI;
  Stream *in_RDI;
  long in_FS_OFFSET;
  QDebugStateSaver saver;
  char in_stack_ffffffffffffff5f;
  QString *t;
  QDebug *in_stack_ffffffffffffff70;
  QDebug *in_stack_ffffffffffffff78;
  QDebug *in_stack_ffffffffffffffa8;
  QDebug *t_00;
  QString local_38;
  QDebug local_20;
  QFlagsStorage<QRegularExpression::PatternOption> in_stack_ffffffffffffffec;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  t_00 = in_RSI;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)in_RDI,in_stack_ffffffffffffff78);
  debug_00 = QDebug::nospace(in_RSI);
  QDebug::operator<<((QDebug *)in_RDI,(char *)t_00);
  t = &local_38;
  QRegularExpression::pattern((QRegularExpression *)t);
  this = QDebug::operator<<(in_stack_ffffffffffffff70,t);
  this_00 = (QDebugStateSaver *)QDebug::operator<<((QDebug *)in_RDI,(char *)t_00);
  QDebug::QDebug(&local_20,(QDebug *)this_00);
  QRegularExpression::patternOptions((QRegularExpression *)this_00);
  operator<<(debug_00,(PatternOptions)in_stack_ffffffffffffffec.i);
  QDebug::operator<<((QDebug *)this_00,in_stack_ffffffffffffff5f);
  QDebug::~QDebug(in_stack_ffffffffffffffa8);
  QDebug::~QDebug(in_stack_ffffffffffffffa8);
  QString::~QString((QString *)0x7314ac);
  QDebug::QDebug(this,(QDebug *)t);
  QDebugStateSaver::~QDebugStateSaver(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QDebug)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug debug, const QRegularExpression &re)
{
    QDebugStateSaver saver(debug);
    debug.nospace() << "QRegularExpression(" << re.pattern() << ", " << re.patternOptions() << ')';
    return debug;
}